

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

bool __thiscall CProficiencies::InterpCommand(CProficiencies *this,char *command,char *argument)

{
  char *pcVar1;
  DO_FUN *pDVar2;
  bool bVar3;
  short sVar4;
  size_t sVar5;
  size_type sVar6;
  const_reference pvVar7;
  long lVar8;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  short pindex;
  size_type foundPos;
  value_type cmd;
  int i;
  size_type prof_cmd_table_size;
  int psn;
  CProficiencies *this_00;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  int local_2c;
  
  sVar5 = strlen(in_RSI);
  if (sVar5 != 0) {
    sVar6 = std::size<std::vector<prof_cmd_type,std::allocator<prof_cmd_type>>>
                      ((vector<prof_cmd_type,_std::allocator<prof_cmd_type>_> *)0x7ac738);
    for (local_2c = 0; (ulong)(long)local_2c < sVar6; local_2c = local_2c + 1) {
      pvVar7 = std::vector<prof_cmd_type,_std::allocator<prof_cmd_type>_>::operator[]
                         (&prof_cmd_table,(long)local_2c);
      pcVar1 = pvVar7->requires;
      psn = (int)((ulong)pvVar7->name >> 0x20);
      pDVar2 = pvVar7->cmd;
      this_00 = (CProficiencies *)&stack0xffffffffffffff8f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      lVar8 = std::__cxx11::string::find(&stack0xffffffffffffff90,(ulong)in_RSI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
      if (lVar8 != -1) {
        sVar4 = ProfIndexLookup((char *)this_00);
        if ((pcVar1 == "none") || (sVar4 == -1)) {
LAB_007ac855:
          (*pDVar2)(*(CHAR_DATA **)(in_RDI + 8),in_RDX);
          return true;
        }
        char_data::Profs(*(char_data **)(in_RDI + 8));
        bVar3 = HasProf(this_00,psn);
        if (bVar3) goto LAB_007ac855;
      }
    }
  }
  return false;
}

Assistant:

bool CProficiencies::InterpCommand(char *command, char *argument)
{
	if (strlen(command) == 0)
		return false;

	auto prof_cmd_table_size = std::size(prof_cmd_table);
	for (auto i = 0; i < prof_cmd_table_size; i++)
	{
		auto cmd = prof_cmd_table[i];
		auto foundPos = std::string(cmd.name).find(command);
		if (foundPos == std::string::npos)
			continue;
		
		auto pindex = ProfIndexLookup(cmd.requires);
		if (cmd.requires == "none" || pindex == -1 || ch->Profs()->HasProf(pindex))
		{
			(cmd.cmd) (ch, argument);
			return true;
		}
	}
			
	return false;
}